

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

CURLcode Curl_open(Curl_easy **curl)

{
  int *piVar1;
  Curl_easy *data;
  char *pcVar2;
  
  data = (Curl_easy *)(*Curl_ccalloc)(1,0x1760);
  if (data != (Curl_easy *)0x0) {
    data->magic = 0xc0dedbad;
    pcVar2 = (char *)(*Curl_cmalloc)(0x4001);
    (data->state).buffer = pcVar2;
    if (pcVar2 == (char *)0x0) {
      pcVar2 = (char *)0x0;
    }
    else {
      pcVar2 = (char *)(*Curl_cmalloc)(0x100);
      (data->state).headerbuff = pcVar2;
      if (pcVar2 != (char *)0x0) {
        Curl_init_userdefined(data);
        (data->state).headersize = 0x100;
        Curl_initinfo(data);
        (data->state).lastconnect = (connectdata *)0x0;
        piVar1 = &(data->progress).flags;
        *(byte *)piVar1 = (byte)*piVar1 | 0x10;
        (data->state).current_speed = -1;
        *curl = data;
        return CURLE_OK;
      }
      pcVar2 = (data->state).buffer;
    }
    (*Curl_cfree)(pcVar2);
    (*Curl_cfree)((data->state).headerbuff);
    Curl_freeset(data);
    (*Curl_cfree)(data);
  }
  return CURLE_OUT_OF_MEMORY;
}

Assistant:

CURLcode Curl_open(struct Curl_easy **curl)
{
  CURLcode result;
  struct Curl_easy *data;

  /* Very simple start-up: alloc the struct, init it with zeroes and return */
  data = calloc(1, sizeof(struct Curl_easy));
  if(!data) {
    /* this is a very serious error */
    DEBUGF(fprintf(stderr, "Error: calloc of Curl_easy failed\n"));
    return CURLE_OUT_OF_MEMORY;
  }

  data->magic = CURLEASY_MAGIC_NUMBER;

  result = Curl_resolver_init(&data->state.resolver);
  if(result) {
    DEBUGF(fprintf(stderr, "Error: resolver_init failed\n"));
    free(data);
    return result;
  }

  /* We do some initial setup here, all those fields that can't be just 0 */

  data->state.buffer = malloc(READBUFFER_SIZE + 1);
  if(!data->state.buffer) {
    DEBUGF(fprintf(stderr, "Error: malloc of buffer failed\n"));
    result = CURLE_OUT_OF_MEMORY;
  }
  else {
    data->state.headerbuff = malloc(HEADERSIZE);
    if(!data->state.headerbuff) {
      DEBUGF(fprintf(stderr, "Error: malloc of headerbuff failed\n"));
      result = CURLE_OUT_OF_MEMORY;
    }
    else {
      result = Curl_init_userdefined(data);

      data->state.headersize = HEADERSIZE;
      Curl_convert_init(data);
      Curl_initinfo(data);

      /* most recent connection is not yet defined */
      data->state.lastconnect = NULL;

      data->progress.flags |= PGRS_HIDE;
      data->state.current_speed = -1; /* init to negative == impossible */

      Curl_http2_init_state(&data->state);
    }
  }

  if(result) {
    Curl_resolver_cleanup(data->state.resolver);
    free(data->state.buffer);
    free(data->state.headerbuff);
    Curl_freeset(data);
    free(data);
    data = NULL;
  }
  else
    *curl = data;

  return result;
}